

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.cpp
# Opt level: O0

SyntaxNode * __thiscall
anon_unknown.dwarf_f82c8a::CloneVisitor::visit<slang::syntax::SequenceMatchListSyntax>
          (CloneVisitor *this,SequenceMatchListSyntax *node)

{
  long lVar1;
  Token token;
  TokenOrSyntax child_00;
  TokenOrSyntax child_01;
  TokenOrSyntax child_02;
  TokenOrSyntax child_03;
  ulong uVar2;
  Token *pTVar3;
  bool bVar4;
  size_t sVar5;
  equal_to<const_slang::syntax::SyntaxNode_*> *peVar6;
  raw_key_type *ppSVar7;
  raw_key_type *__y;
  add_pointer_t<const_slang::syntax::detail::ReplaceChange> ptVar8;
  long lVar9;
  logic_error *plVar10;
  long in_RDI;
  const_iterator it_2;
  add_pointer_t<const_slang::syntax::detail::ReplaceChange> replaceChange;
  const_iterator it_1;
  const_iterator it;
  SyntaxNode *child;
  size_t i;
  bool skipSeparator;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> listBuffer;
  bool IsList;
  SequenceMatchListSyntax *cloned;
  size_t hash;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  SyntaxNode *in_stack_fffffffffffff888;
  SequenceMatchListSyntax *in_stack_fffffffffffff890;
  SyntaxNode *in_stack_fffffffffffff898;
  SyntaxNode *in_stack_fffffffffffff8a0;
  SyntaxNode *in_stack_fffffffffffff8a8;
  SequenceMatchListSyntax *in_stack_fffffffffffff8b0;
  SequenceMatchListSyntax *in_stack_fffffffffffff8c0;
  table_element_pointer in_stack_fffffffffffff8c8;
  SequenceMatchListSyntax *in_stack_fffffffffffff8d0;
  BumpAllocator *in_stack_fffffffffffff9d8;
  Token *in_stack_fffffffffffff9e0;
  SyntaxNode *local_500;
  SequenceMatchListSyntax *pSStack_4f8;
  SyntaxNode *local_4f0;
  SyntaxNode *local_4e8;
  SequenceMatchListSyntax *pSStack_4e0;
  SyntaxNode *local_4d8;
  SyntaxNode *local_4d0;
  SequenceMatchListSyntax *pSStack_4c8;
  SyntaxNode *local_4c0;
  SyntaxNode *local_450;
  SequenceMatchListSyntax *pSStack_448;
  SyntaxNode *local_440;
  SyntaxNode *local_420 [3];
  ulong local_408;
  undefined1 local_3f9;
  undefined1 local_319;
  SequenceMatchListSyntax *local_318;
  Token *local_300;
  long local_2f8;
  SequenceMatchListSyntax *local_2f0;
  table_element_pointer local_2e8;
  Token *local_2e0;
  long local_2d8;
  char_pointer local_2d0;
  table_element_pointer local_2c8;
  Token *local_2c0;
  BumpAllocator *local_2b8;
  char_pointer local_2b0;
  table_element_pointer local_2a8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_2a0;
  Token *local_290;
  long local_288;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_280;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_270;
  Token *local_260;
  long local_258;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_250;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
  local_240;
  Token *local_228;
  long local_220;
  iterator local_218;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
  local_208;
  Token *local_1f0;
  long local_1e8;
  iterator local_1e0;
  size_t local_1d0;
  Token *local_1c8;
  long local_1c0;
  size_t local_1b8;
  Token *local_1b0;
  long local_1a8;
  uint local_19c;
  value_type *local_198;
  value_type *local_190;
  uint local_184;
  group_type *local_180;
  size_t local_178;
  pow2_quadratic_prober local_170;
  size_t local_160;
  size_t local_158;
  Token *local_150;
  long local_148;
  uint local_13c;
  value_type *local_138;
  value_type *local_130;
  uint local_124;
  group_type *local_120;
  size_t local_118;
  pow2_quadratic_prober local_110;
  size_t local_100;
  size_t local_f8;
  Token *local_f0;
  long local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  Token *local_d0;
  BumpAllocator *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>
  local_b0;
  Token *local_98;
  BumpAllocator *local_90;
  iterator local_88;
  size_t local_78;
  Token *local_70;
  BumpAllocator *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Token *local_10;
  BumpAllocator *local_8;
  
  local_318 = slang::syntax::clone<slang::syntax::SequenceMatchListSyntax>
                        (in_stack_fffffffffffff890,(BumpAllocator *)in_stack_fffffffffffff888);
  local_319 = 0;
  slang::SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xe1cff4);
  local_3f9 = 0;
  local_408 = 0;
  do {
    uVar2 = local_408;
    sVar5 = slang::syntax::SyntaxNode::getChildCount(in_stack_fffffffffffff898);
    if (sVar5 <= uVar2) {
      slang::SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xe1e257);
      return &local_318->super_SyntaxNode;
    }
    local_420[0] = slang::syntax::SyntaxNode::childNode
                             (in_stack_fffffffffffff8a8,(size_t)in_stack_fffffffffffff8a0);
    if (local_420[0] == (SyntaxNode *)0x0) {
      slang::syntax::SequenceMatchListSyntax::getChild
                (in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
      bVar4 = slang::syntax::ConstTokenOrSyntax::isToken((ConstTokenOrSyntax *)0xe1d0b2);
      if (bVar4) {
        slang::syntax::SyntaxNode::childToken
                  (in_stack_fffffffffffff8a0,(size_t)in_stack_fffffffffffff898);
        slang::parsing::Token::deepClone(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        token.info = (Info *)in_stack_fffffffffffff8a0;
        token._0_8_ = in_stack_fffffffffffff898;
        slang::syntax::TokenOrSyntax::TokenOrSyntax
                  ((TokenOrSyntax *)in_stack_fffffffffffff890,token);
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_first._M_storage.info = (Info *)in_stack_fffffffffffff8c8;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)in_stack_fffffffffffff8c0;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _16_8_ = in_stack_fffffffffffff8d0;
        in_stack_fffffffffffff888 = local_450;
        in_stack_fffffffffffff890 = pSStack_448;
        in_stack_fffffffffffff898 = local_440;
        slang::syntax::SequenceMatchListSyntax::setChild
                  (in_stack_fffffffffffff8b0,(size_t)in_stack_fffffffffffff8a8,child_00);
      }
    }
    else {
      lVar1 = *(long *)(in_RDI + 8);
      local_2e0 = (Token *)local_420;
      local_2d8 = lVar1;
      local_290 = local_2e0;
      local_288 = lVar1;
      local_1f0 = local_2e0;
      local_1e8 = lVar1;
      local_1c8 = local_2e0;
      local_1c0 = lVar1;
      local_1d0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                  ::hash_for<slang::syntax::SyntaxNode_const*>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                              *)in_stack_fffffffffffff890,(SyntaxNode **)in_stack_fffffffffffff888);
      pTVar3 = local_1c8;
      local_f8 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                                 *)in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
      local_f0 = pTVar3;
      local_100 = local_1d0;
      local_e8 = lVar1;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_110,local_f8);
      do {
        local_118 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_110);
        local_120 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                    ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                              *)0xe1d345);
        local_120 = local_120 + local_118;
        local_124 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff898,(size_t)in_stack_fffffffffffff890);
        if (local_124 != 0) {
          local_130 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                      ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                                  *)0xe1d3a3);
          local_138 = local_130 + local_118 * 0xf;
          do {
            local_13c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            peVar6 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                             *)0xe1d3f6);
            pTVar3 = local_f0;
            ppSVar7 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                      ::
                      key_from<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>
                                ((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                                  *)0xe1d429);
            bVar4 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                              (peVar6,(SyntaxNode **)pTVar3,ppSVar7);
            if (bVar4) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
              ::table_locator(&local_208,local_120,local_13c,local_138 + local_13c);
              goto LAB_00e1d545;
            }
            local_124 = local_124 - 1 & local_124;
          } while (local_124 != 0);
        }
        bVar4 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
        if (bVar4) {
          memset(&local_208,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
          ::table_locator(&local_208);
          goto LAB_00e1d545;
        }
        bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_110,*(size_t *)(lVar1 + 8));
      } while (bVar4);
      memset(&local_208,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
      ::table_locator(&local_208);
LAB_00e1d545:
      local_1e0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                  ::make_iterator((locator *)0xe1d556);
      local_2a0.pc_ = local_1e0.pc_;
      local_2a0.p_ = local_1e0.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_280,&local_2a0);
      local_2d0 = local_280.pc_;
      local_2c8 = local_280.p_;
      boost::unordered::
      unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
      ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
             *)0xe1d64c);
      bVar4 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff890,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff888);
      if (bVar4) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar10,"Can\'t use insertBefore or insertAfter on a non-list node");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      in_stack_fffffffffffff9d8 = (BumpAllocator *)(*(long *)(in_RDI + 8) + 0x60);
      local_2c0 = (Token *)local_420;
      local_2b8 = in_stack_fffffffffffff9d8;
      local_d0 = local_2c0;
      local_c8 = in_stack_fffffffffffff9d8;
      local_98 = local_2c0;
      local_90 = in_stack_fffffffffffff9d8;
      local_70 = local_2c0;
      local_68 = in_stack_fffffffffffff9d8;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
                 ::hash_for<slang::syntax::SyntaxNode_const*>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                             *)in_stack_fffffffffffff890,(SyntaxNode **)in_stack_fffffffffffff888);
      in_stack_fffffffffffff9e0 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                                 *)in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
      local_20 = local_78;
      local_10 = in_stack_fffffffffffff9e0;
      local_8 = in_stack_fffffffffffff9d8;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                   ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                             *)0xe1d868);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff898,(size_t)in_stack_fffffffffffff890);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                     ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                                 *)0xe1d8c6);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            peVar6 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                             *)0xe1d919);
            pTVar3 = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
                  ::
                  key_from<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>
                            ((pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>
                              *)0xe1d950);
            bVar4 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                              (peVar6,(SyntaxNode **)pTVar3,__y);
            if (bVar4) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_00e1da6c;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar4 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
        if (bVar4) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>
          ::table_locator(&local_b0);
          goto LAB_00e1da6c;
        }
        bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,(size_t)in_stack_fffffffffffff9d8->endPtr);
      } while (bVar4);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>
      ::table_locator(&local_b0);
LAB_00e1da6c:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                 ::make_iterator((locator *)0xe1da7d);
      local_e0.pc_ = local_88.pc_;
      local_e0.p_ = local_88.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_2b0 = local_c0.pc_;
      local_2a8 = local_c0.p_;
      boost::unordered::
      unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
      ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
             *)0xe1db77);
      bVar4 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff890,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff888);
      if (bVar4) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffff890);
        ptVar8 = std::
                 get_if<slang::syntax::detail::ReplaceChange,slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>
                           ((variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                             *)0xe1dbce);
        if (ptVar8 == (add_pointer_t<const_slang::syntax::detail::ReplaceChange>)0x0) {
          slang::syntax::TokenOrSyntax::TokenOrSyntax
                    ((TokenOrSyntax *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
          child_02.super_ConstTokenOrSyntax.
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _M_u._M_first._M_storage.info = (Info *)in_stack_fffffffffffff8c8;
          child_02.super_ConstTokenOrSyntax.
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _M_u._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
                         in_stack_fffffffffffff8c0;
          child_02.super_ConstTokenOrSyntax.
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _16_8_ = in_stack_fffffffffffff8d0;
          in_stack_fffffffffffff888 = local_4e8;
          in_stack_fffffffffffff890 = pSStack_4e0;
          in_stack_fffffffffffff898 = local_4d8;
          slang::syntax::SequenceMatchListSyntax::setChild
                    (in_stack_fffffffffffff8b0,(size_t)in_stack_fffffffffffff8a8,child_02);
        }
        else {
          slang::syntax::TokenOrSyntax::TokenOrSyntax
                    ((TokenOrSyntax *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
          child_01.super_ConstTokenOrSyntax.
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _M_u._M_first._M_storage.info = (Info *)in_stack_fffffffffffff8c8;
          child_01.super_ConstTokenOrSyntax.
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _M_u._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
                         in_stack_fffffffffffff8c0;
          child_01.super_ConstTokenOrSyntax.
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _16_8_ = in_stack_fffffffffffff8d0;
          in_stack_fffffffffffff888 = local_4d0;
          in_stack_fffffffffffff890 = pSStack_4c8;
          in_stack_fffffffffffff898 = local_4c0;
          slang::syntax::SequenceMatchListSyntax::setChild
                    (in_stack_fffffffffffff8b0,(size_t)in_stack_fffffffffffff8a8,child_01);
        }
      }
      else {
        slang::syntax::SyntaxNode::visit<(anonymous_namespace)::CloneVisitor>
                  (&in_stack_fffffffffffff890->super_SyntaxNode,
                   (CloneVisitor *)in_stack_fffffffffffff888);
        slang::syntax::TokenOrSyntax::TokenOrSyntax
                  ((TokenOrSyntax *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
        child_03.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_first._M_storage.info = (Info *)in_stack_fffffffffffff8c8;
        child_03.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)in_stack_fffffffffffff8c0;
        child_03.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _16_8_ = in_stack_fffffffffffff8d0;
        in_stack_fffffffffffff888 = local_500;
        in_stack_fffffffffffff890 = pSStack_4f8;
        in_stack_fffffffffffff898 = local_4f0;
        slang::syntax::SequenceMatchListSyntax::setChild
                  (in_stack_fffffffffffff8b0,(size_t)in_stack_fffffffffffff8a8,child_03);
      }
      lVar1 = *(long *)(in_RDI + 8);
      lVar9 = lVar1 + 0x30;
      local_300 = (Token *)local_420;
      local_2f8 = lVar9;
      local_260 = local_300;
      local_258 = lVar9;
      local_228 = local_300;
      local_220 = lVar9;
      local_1b0 = local_300;
      local_1a8 = lVar9;
      local_1b8 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                  ::hash_for<slang::syntax::SyntaxNode_const*>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                              *)in_stack_fffffffffffff890,(SyntaxNode **)in_stack_fffffffffffff888);
      pTVar3 = local_1b0;
      local_158 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                                  *)in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
      local_150 = pTVar3;
      local_160 = local_1b8;
      local_148 = lVar9;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_170,local_158);
      do {
        local_178 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_170);
        local_180 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                    ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                              *)0xe1debb);
        local_180 = local_180 + local_178;
        local_184 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff898,(size_t)in_stack_fffffffffffff890);
        if (local_184 != 0) {
          local_190 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                      ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                                  *)0xe1df19);
          local_198 = local_190 + local_178 * 0xf;
          do {
            local_19c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            peVar6 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                             *)0xe1df6c);
            pTVar3 = local_150;
            ppSVar7 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                      ::
                      key_from<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>
                                ((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                                  *)0xe1df99);
            bVar4 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                              (peVar6,(SyntaxNode **)pTVar3,ppSVar7);
            if (bVar4) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
              ::table_locator(&local_240,local_180,local_19c,local_198 + local_19c);
              goto LAB_00e1e0a9;
            }
            local_184 = local_184 - 1 & local_184;
          } while (local_184 != 0);
        }
        bVar4 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
        if (bVar4) {
          memset(&local_240,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
          ::table_locator(&local_240);
          goto LAB_00e1e0a9;
        }
        bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_170,*(size_t *)(lVar1 + 0x38));
      } while (bVar4);
      memset(&local_240,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>
      ::table_locator(&local_240);
LAB_00e1e0a9:
      local_218 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
                  ::make_iterator((locator *)0xe1e0ba);
      local_270.pc_ = local_218.pc_;
      local_270.p_ = local_218.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_250,&local_270);
      local_2f0 = (SequenceMatchListSyntax *)local_250.pc_;
      local_2e8 = local_250.p_;
      in_stack_fffffffffffff8c0 = (SequenceMatchListSyntax *)local_250.pc_;
      in_stack_fffffffffffff8c8 = local_250.p_;
      in_stack_fffffffffffff8d0 = (SequenceMatchListSyntax *)local_250.pc_;
      boost::unordered::
      unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
      ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
             *)0xe1e190);
      bVar4 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff890,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff888);
      if (bVar4) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar10,"Can\'t use insertBefore or insertAfter on a non-list node");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    local_408 = local_408 + 1;
  } while( true );
}

Assistant:

SyntaxNode* visit(const T& node) {
        T* cloned = clone(node, alloc);

        constexpr bool IsList = std::is_same_v<T, SyntaxListBase>;
        SmallVector<TokenOrSyntax, 8> listBuffer;
        bool skipSeparator = false;

        if constexpr (IsList) {
            if (auto it = commits.listInsertAtFront.find(&node);
                it != commits.listInsertAtFront.end()) {

                const SyntaxChange* lastChange = nullptr;
                for (const auto& change : it->second) {
                    if (!listBuffer.empty() && change.separator)
                        listBuffer.push_back(change.separator);
                    listBuffer.push_back(change.second);
                    lastChange = &change;
                }

                if (lastChange && node.getChildCount() && lastChange->separator)
                    listBuffer.push_back(lastChange->separator);
            }
        }

        for (size_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (!child) {
                if constexpr (IsList) {
                    if (!skipSeparator)
                        listBuffer.push_back(node.childToken(i).deepClone(alloc));
                    skipSeparator = false;
                }
                else {
                    if (node.getChild(i).isToken()) { // check since it might be null node
                        cloned->setChild(i, node.childToken(i).deepClone(alloc));
                    }
                }
                continue;
            }

            if (auto it = commits.insertBefore.find(child); it != commits.insertBefore.end()) {
                if (!IsList) {
                    SLANG_THROW(std::logic_error(
                        "Can't use insertBefore or insertAfter on a non-list node"));
                }

                for (const auto& change : it->second)
                    listBuffer.push_back(change.second);
            }

            if (auto it = commits.removeOrReplace.find(child);
                it != commits.removeOrReplace.end()) {
                if (auto replaceChange = std::get_if<ReplaceChange>(&it->second)) {
                    if constexpr (IsList)
                        listBuffer.push_back(replaceChange->second);
                    else
                        cloned->setChild(i, replaceChange->second);
                }
                else {
                    if constexpr (!IsList) {
                        static SyntaxNode* emptyNode = nullptr;
                        cloned->setChild(i, emptyNode);
                    }
                    else {
                        skipSeparator = true; // remove separator related to removed node
                    }
                }
            }
            else {
                if constexpr (IsList) {
                    listBuffer.push_back(child->visit(*this));
                }
                else {
                    cloned->setChild(i, child->visit(*this));
                }
            }

            if (auto it = commits.insertAfter.find(child); it != commits.insertAfter.end()) {
                if (!IsList) {
                    SLANG_THROW(std::logic_error(
                        "Can't use insertBefore or insertAfter on a non-list node"));
                }

                for (const auto& change : it->second)
                    listBuffer.push_back(change.second);
            }
        }

        if constexpr (IsList) {
            if (skipSeparator) {
                // remove trailing sep if it wasn't there before transform
                bool isClonedTrailing = !listBuffer.empty() && listBuffer.back().isToken();
                bool isOriginalTrailing = node.getChildCount() &&
                                          node.getChild(node.getChildCount() - 1).isToken();
                if (isClonedTrailing && !isOriginalTrailing)
                    listBuffer.pop_back();
            }
            if (auto it = commits.listInsertAtBack.find(&node);
                it != commits.listInsertAtBack.end()) {

                for (const auto& change : it->second) {
                    if (!listBuffer.empty() && change.separator)
                        listBuffer.push_back(change.separator);
                    listBuffer.push_back(change.second);
                }
            }

            cloned->resetAll(alloc, listBuffer);
        }

        return cloned;
    }